

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void __thiscall wasm::Literal::Literal(Literal *this,LaneArray<8> *lanes)

{
  LaneArray<8> *lanes_local;
  Literal *this_local;
  
  wasm::Type::Type(&this->type,v128);
  extractBytes<unsigned_short,8>((uint8_t (*) [16])this,lanes);
  return;
}

Assistant:

Literal::Literal(const LaneArray<8>& lanes) : type(Type::v128) {
  extractBytes<uint16_t, 8>(v128, lanes);
}